

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov7_pnnx.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined4 uVar7;
  ulong uVar4;
  undefined4 uVar8;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar9;
  char *pcVar10;
  undefined8 *puVar11;
  int *piVar12;
  char cVar13;
  int iVar14;
  pointer pOVar15;
  ulong uVar16;
  float *pfVar17;
  ulong uVar18;
  pointer pOVar19;
  ulong uVar20;
  vector<Object,_std::allocator<Object>_> *objects_00;
  long lVar21;
  uint left;
  float fVar22;
  float fVar23;
  int top;
  float fVar26;
  __m128 t_2;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar27;
  __m128 t;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vector<Object,_std::allocator<Object>_> objects8;
  allocator local_379;
  vector<Object,_std::allocator<Object>_> proposals;
  int baseLine;
  Extractor ex;
  undefined1 local_348 [64];
  size_t local_308;
  vector<float,_std::allocator<float>_> areas;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  vector<Object,_std::allocator<Object>_> objects;
  float norm_vals [3];
  undefined1 local_258 [64];
  size_t local_218;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  Mat image;
  undefined4 local_1f0;
  int iStack_1ec;
  Allocator *local_1d8;
  Mat m;
  undefined8 local_190;
  uchar *local_188;
  Net yolov7;
  
  if (argc == 2) {
    pcVar10 = argv[1];
    std::__cxx11::string::string((string *)&yolov7,pcVar10,(allocator *)&image);
    cv::imread((string *)&m,(int)&yolov7);
    std::__cxx11::string::~string((string *)&yolov7);
    cVar13 = cv::Mat::empty();
    if (cVar13 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&yolov7);
      yolov7.opt.use_vulkan_compute = true;
      ncnn::Net::load_param(&yolov7,"yolov7.param");
      ncnn::Net::load_model(&yolov7,"yolov7.bin");
      local_208 = (float)local_190;
      fStack_204 = (float)((ulong)local_190 >> 0x20);
      fStack_200 = 0.0;
      fStack_1fc = 0.0;
      if ((int)local_208 < (int)fStack_204) {
        local_2a8._4_4_ = 640.0 / (float)(int)fStack_204;
        iVar14 = (int)((float)(int)local_208 * (float)local_2a8._4_4_);
        iVar27 = 0x280;
      }
      else {
        local_2a8._4_4_ = 640.0 / (float)(int)local_208;
        iVar27 = (int)((float)(int)fStack_204 * (float)local_2a8._4_4_);
        iVar14 = 0x280;
      }
      ncnn::Mat::from_pixels_resize
                ((Mat *)&image,local_188,0x10002,(int)fStack_204,(int)local_208,iVar27,iVar14,
                 (Allocator *)0x0);
      local_218 = 0;
      local_258._0_4_ = 0;
      local_258._4_4_ = 0;
      local_258._8_4_ = 0;
      local_258._12_4_ = 0;
      local_258._16_4_ = 0;
      local_258._20_4_ = 0;
      local_258._24_4_ = 0;
      local_258._32_8_ = (Allocator *)0x0;
      local_258._40_4_ = 0;
      local_258._44_4_ = 0;
      local_258._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Option::Option((Option *)&areas);
      iVar27 = ((iVar27 + 0x3f) / 0x40) * 0x40 - iVar27;
      iVar14 = ((iVar14 + 0x3f) / 0x40) * 0x40 - iVar14;
      left = iVar27 / 2;
      top = iVar14 / 2;
      objects_00 = (vector<Object,_std::allocator<Object>_> *)(ulong)left;
      ncnn::copy_make_border
                ((Mat *)&image,(Mat *)local_258,top,iVar14 - top,left,iVar27 - left,0,114.0,
                 (Option *)&areas);
      norm_vals[0] = 0.003921569;
      norm_vals[1] = 0.003921569;
      norm_vals[2] = 0.003921569;
      ncnn::Mat::substract_mean_normalize((Mat *)local_258,(float *)0x0,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"in0",(Mat *)local_258);
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Extractor::extract(&ex,"out0",(Mat *)&areas,0);
      local_308 = 0;
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_8_ = (pointer)0x0;
      local_348._24_4_ = 0;
      local_348._32_8_ = (Allocator *)0x0;
      local_348._40_4_ = 0;
      local_348._44_4_ = 0;
      local_348._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_348,6,4,(Allocator *)0x0);
      puVar11 = (undefined8 *)CONCAT44(local_348._4_4_,local_348._0_4_);
      *puVar11 = 0x4180000041400000;
      puVar11[1] = 0x4210000041980000;
      puVar11[2] = 0x41e0000042200000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)local_348,8,(Mat *)&areas,(Mat *)&objects8,0.0,objects_00);
      std::vector<Object,std::allocator<Object>>::
      insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>,void>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 (const_iterator)
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects8.super__Vector_base<Object,_std::allocator<Object>_>);
      piVar12 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if ((Allocator *)local_348._32_8_ == (Allocator *)0x0) {
            free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
          }
          else {
            (*(*(_func_int ***)local_348._32_8_)[3])();
          }
        }
      }
      piVar12 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Extractor::extract(&ex,"out1",(Mat *)&areas,0);
      local_308 = 0;
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_8_ = (pointer)0x0;
      local_348._24_4_ = 0;
      local_348._32_8_ = (Allocator *)0x0;
      local_348._40_4_ = 0;
      local_348._44_4_ = 0;
      local_348._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_348,6,4,(Allocator *)0x0);
      puVar11 = (undefined8 *)CONCAT44(local_348._4_4_,local_348._0_4_);
      *puVar11 = 0x4296000042100000;
      puVar11[1] = 0x425c000042980000;
      puVar11[2] = 0x4312000042900000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)local_348,0x10,(Mat *)&areas,(Mat *)&objects8,0.0,objects_00);
      std::vector<Object,std::allocator<Object>>::
      insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>,void>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 (const_iterator)
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects8.super__Vector_base<Object,_std::allocator<Object>_>);
      piVar12 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if ((Allocator *)local_348._32_8_ == (Allocator *)0x0) {
            free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
          }
          else {
            (*(*(_func_int ***)local_348._32_8_)[3])();
          }
        }
      }
      piVar12 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Extractor::extract(&ex,"out2",(Mat *)&areas,0);
      local_308 = 0;
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_8_ = (pointer)0x0;
      local_348._24_4_ = 0;
      local_348._32_8_ = (Allocator *)0x0;
      local_348._40_4_ = 0;
      local_348._44_4_ = 0;
      local_348._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_348,6,4,(Allocator *)0x0);
      puVar11 = (undefined8 *)CONCAT44(local_348._4_4_,local_348._0_4_);
      *puVar11 = 0x42dc0000430e0000;
      puVar11[1] = 0x4373000043400000;
      puVar11[2] = 0x43c8800043e58000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)local_348,0x20,(Mat *)&areas,(Mat *)&objects8,0.0,objects_00);
      std::vector<Object,std::allocator<Object>>::
      insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>,void>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 (const_iterator)
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects8.super__Vector_base<Object,_std::allocator<Object>_>);
      piVar12 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if ((Allocator *)local_348._32_8_ == (Allocator *)0x0) {
            free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
          }
          else {
            (*(*(_func_int ***)local_348._32_8_)[3])();
          }
        }
      }
      piVar12 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      pOVar15 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start !=
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        qsort_descent_inplace
                  (&proposals,0,
                   (int)(((long)proposals.super__Vector_base<Object,_std::allocator<Object>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl
                               .super__Vector_impl_data._M_start) / 0x18) + -1);
        pOVar15 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_8_ = (pointer)0x0;
      uVar16 = ((long)pOVar15 -
               (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x18;
      iVar27 = (int)uVar16;
      std::vector<float,_std::allocator<float>_>::vector
                (&areas,(long)iVar27,(allocator_type *)&objects8);
      uVar18 = 0;
      uVar20 = 0;
      if (0 < iVar27) {
        uVar20 = uVar16 & 0xffffffff;
      }
      pfVar17 = &((proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                   super__Vector_impl_data._M_start)->rect).height;
      for (; uVar20 != uVar18; uVar18 = uVar18 + 1) {
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar18] = pfVar17[-1] * *pfVar17;
        pfVar17 = pfVar17 + 6;
      }
      iVar14 = 0;
      while( true ) {
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_start._0_4_ = (float)iVar14;
        if (iVar27 <= iVar14) break;
        pOVar15 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start + iVar14;
        uVar18 = (ulong)(CONCAT44(local_348._12_4_,local_348._8_4_) -
                        CONCAT44(local_348._4_4_,local_348._0_4_)) >> 2;
        uVar16 = uVar18 & 0xffffffff;
        if ((int)uVar18 < 1) {
          uVar16 = 0;
        }
        uVar18 = 1;
        for (uVar20 = 0; uVar16 != uVar20; uVar20 = uVar20 + 1) {
          iVar9 = *(int *)(CONCAT44(local_348._4_4_,local_348._0_4_) + uVar20 * 4);
          if (pOVar15->label ==
              proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
              super__Vector_impl_data._M_start[iVar9].label) {
            pOVar19 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                      super__Vector_impl_data._M_start + iVar9;
            uVar3._0_4_ = (pOVar15->rect).x;
            uVar3._4_4_ = (pOVar15->rect).y;
            auVar28._8_8_ = 0;
            auVar28._0_8_ = uVar3;
            uVar1 = (pOVar15->rect).width;
            uVar7 = (pOVar15->rect).height;
            uVar4._0_4_ = (pOVar19->rect).x;
            uVar4._4_4_ = (pOVar19->rect).y;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = uVar4;
            uVar2 = (pOVar19->rect).width;
            uVar8 = (pOVar19->rect).height;
            auVar24._0_4_ = (float)uVar2 + (float)(undefined4)uVar4;
            auVar24._4_4_ = (float)uVar8 + (float)uVar4._4_4_;
            auVar24._8_8_ = 0;
            auVar32 = maxps(auVar31,auVar28);
            auVar30._0_4_ = (float)uVar1 + (float)(undefined4)uVar3;
            auVar30._4_4_ = (float)uVar7 + (float)uVar3._4_4_;
            auVar30._8_8_ = 0;
            auVar25 = minps(auVar24,auVar30);
            fVar22 = auVar25._0_4_ - auVar32._0_4_;
            fVar26 = auVar25._4_4_ - auVar32._4_4_;
            fVar23 = 0.0;
            if (0.0 < fVar26 && 0.0 < fVar22) {
              fVar23 = fVar22 * fVar26;
            }
            if (0.45 < fVar23 / ((areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start[iVar14] +
                                 areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar9]) - fVar23)) {
              uVar18 = 0;
            }
          }
        }
        if ((int)uVar18 != 0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_348,
                     (value_type_conflict1 *)&objects8);
          iVar14 = (int)objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_;
        }
        iVar14 = iVar14 + 1;
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&areas.super__Vector_base<float,_std::allocator<float>_>);
      uVar16 = (ulong)(CONCAT44(local_348._12_4_,local_348._8_4_) -
                      CONCAT44(local_348._4_4_,local_348._0_4_)) >> 2;
      iVar27 = (int)uVar16;
      std::vector<Object,_std::allocator<Object>_>::resize(&objects,(long)iVar27);
      iVar14 = (int)fStack_204 + -1;
      fStack_204 = (float)((int)local_208 + -1);
      local_208 = (float)iVar14;
      fStack_200 = (float)((int)fStack_200 + -1);
      fStack_1fc = (float)((int)fStack_1fc + -1);
      uVar18 = 0;
      uVar16 = uVar16 & 0xffffffff;
      if (iVar27 < 1) {
        uVar16 = uVar18;
      }
      local_2a8._0_4_ = local_2a8._4_4_;
      fStack_2a0 = (float)local_2a8._4_4_;
      fStack_29c = (float)local_2a8._4_4_;
      lVar21 = 8;
      for (; uVar16 != uVar18; uVar18 = uVar18 + 1) {
        Object::operator=((Object *)
                          ((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl
                                 .super__Vector_impl_data._M_start + lVar21 + -8),
                          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                          super__Vector_impl_data._M_start +
                          *(int *)(CONCAT44(local_348._4_4_,local_348._0_4_) + uVar18 * 4));
        uVar5 = *(undefined8 *)
                 ((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar21 + -8);
        uVar6 = *(undefined8 *)
                 ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_start)->rect).x + lVar21);
        fVar22 = (float)uVar5;
        fVar23 = (float)((ulong)uVar5 >> 0x20);
        auVar32._0_4_ = fVar22 - (float)(int)left;
        auVar32._4_4_ = fVar23 - (float)top;
        auVar32._8_8_ = 0;
        auVar32 = divps(auVar32,_local_2a8);
        auVar29._0_4_ = ((float)uVar6 + fVar22) - (float)(int)left;
        auVar29._4_4_ = ((float)((ulong)uVar6 >> 0x20) + fVar23) - (float)top;
        auVar29._8_8_ = 0;
        auVar29 = divps(auVar29,_local_2a8);
        auVar25._4_4_ = fStack_204;
        auVar25._0_4_ = local_208;
        auVar25._8_4_ = fStack_200;
        auVar25._12_4_ = fStack_1fc;
        auVar32 = minps(auVar25,auVar32);
        auVar32 = maxps(ZEXT816(0),auVar32);
        auVar25 = minps(auVar25,auVar29);
        auVar25 = maxps(ZEXT816(0),auVar25);
        *(long *)((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar21 + -8) = auVar32._0_8_;
        *(ulong *)((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                            super__Vector_impl_data._M_start)->rect).x + lVar21) =
             CONCAT44(auVar25._4_4_ - auVar32._4_4_,auVar25._0_4_ - auVar32._0_4_);
        lVar21 = lVar21 + 0x18;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)local_348);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&proposals.super__Vector_base<Object,_std::allocator<Object>_>);
      ncnn::Extractor::~Extractor(&ex);
      piVar12 = (int *)CONCAT44(local_258._12_4_,local_258._8_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if ((Allocator *)local_258._32_8_ == (Allocator *)0x0) {
            free((void *)CONCAT44(local_258._4_4_,local_258._0_4_));
          }
          else {
            (*(*(_func_int ***)local_258._32_8_)[3])();
          }
        }
      }
      piVar12 = (int *)CONCAT44(iStack_1ec,local_1f0);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_1d8 == (Allocator *)0x0) {
            free(_image);
          }
          else {
            (*local_1d8->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&yolov7);
      cv::Mat::clone();
      lVar21 = 0;
      uVar16 = 0;
      while( true ) {
        pOVar15 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_258._8_8_ = &image;
        if ((ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x18) <= uVar16) break;
        fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                (double)*(float *)((long)&(objects.
                                           super__Vector_base<Object,_std::allocator<Object>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->prob + lVar21)
                ,(double)*(float *)((long)&((objects.
                                             super__Vector_base<Object,_std::allocator<Object>_>.
                                             _M_impl.super__Vector_impl_data._M_start)->rect).x +
                                   lVar21),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).y +
                                  lVar21),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).width +
                                  lVar21),
                SUB84((double)*(float *)((long)&((objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rect).
                                                height + lVar21),0),
                (ulong)*(uint *)((long)&(objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->label + lVar21)
               );
        local_258._16_4_ = 0;
        local_258._20_4_ = 0;
        local_258._0_4_ = 0x3010000;
        pfVar17 = (float *)((long)&(pOVar15->rect).x + lVar21);
        proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ = (int)ROUND(pfVar17[1]);
        proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = (int)ROUND(*pfVar17);
        proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = (int)ROUND(pfVar17[2]);
        proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = (int)ROUND(pfVar17[3]);
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&yolov7);
        yolov7._vptr_Net = (_func_int **)0x406fe00000000000;
        yolov7.opt.lightmode = false;
        yolov7.opt.use_shader_pack8 = false;
        yolov7.opt.use_subgroup_ops = false;
        yolov7.opt.use_reserved_0 = false;
        yolov7.opt.num_threads = 0;
        yolov7.opt.blob_allocator = (Allocator *)0x0;
        yolov7.opt.workspace_allocator = (Allocator *)0x0;
        cv::rectangle((string *)local_258,&proposals,&yolov7,1,8,0);
        sprintf((char *)&yolov7,"%s %.1f%%",
                (double)(*(float *)((long)&pOVar15->prob + lVar21) * 100.0),
                _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                *(int *)(_ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                        + (long)*(int *)((long)&pOVar15->label + lVar21) * 4));
        std::__cxx11::string::string((string *)local_258,(char *)&yolov7,(allocator *)local_348);
        cv::getTextSize((string *)&ex,(int)(string *)local_258,0.5,0,(int *)0x1);
        std::__cxx11::string::~string((string *)local_258);
        fVar22 = (float)(int)*(float *)((long)&(pOVar15->rect).x + lVar21);
        iVar27 = (int)((*(float *)((long)&(pOVar15->rect).y + lVar21) -
                       (float)ex._vptr_Extractor._4_4_) - 0.0);
        if (iVar27 < 1) {
          iVar27 = 0;
        }
        fVar23 = (float)(iStack_1ec - (int)ex._vptr_Extractor);
        if ((int)ex._vptr_Extractor + (int)fVar22 <= iStack_1ec) {
          fVar23 = fVar22;
        }
        local_348._16_8_ = (pointer)0x0;
        local_348._0_4_ = 0x3010000;
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_start._4_4_ = iVar27;
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_start._0_4_ = fVar23;
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_finish._0_4_ = (int)ex._vptr_Extractor;
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_finish._4_4_ = ex._vptr_Extractor._4_4_;
        local_348._8_8_ = &image;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)local_258);
        local_258._0_4_ = 0;
        local_258._4_4_ = 0x406fe000;
        local_258._8_4_ = 0;
        local_258._12_4_ = 0x406fe000;
        local_258._16_4_ = 0;
        local_258._20_4_ = 0x406fe000;
        local_258._24_4_ = 0;
        local_258._28_4_ = 0;
        cv::rectangle(local_348,&objects8,(string *)local_258,0xffffffffffffffff,8,0);
        local_348._16_8_ = (pointer)0x0;
        local_348._0_4_ = 0x3010000;
        local_348._8_8_ = &image;
        std::__cxx11::string::string((string *)local_258,(char *)&yolov7,&local_379);
        norm_vals[1] = (float)(iVar27 + ex._vptr_Extractor._4_4_);
        norm_vals[0] = fVar23;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&areas);
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = 0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._4_4_ = 0;
        cv::putText(0x3fe0000000000000,local_348,(string *)local_258,norm_vals,0,
                    (Matx<double,_4,_1> *)&areas,1,8,0);
        std::__cxx11::string::~string((string *)local_258);
        uVar16 = uVar16 + 1;
        lVar21 = lVar21 + 0x18;
      }
      std::__cxx11::string::string((string *)&yolov7,"image",(allocator *)local_348);
      local_258._16_4_ = 0;
      local_258._20_4_ = 0;
      local_258._0_4_ = 0x1010000;
      cv::imshow((string *)&yolov7,(_InputArray *)local_258);
      std::__cxx11::string::~string((string *)&yolov7);
      iVar27 = 0;
      cv::waitKey(0);
      cv::Mat::~Mat(&image);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects.super__Vector_base<Object,_std::allocator<Object>_>);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar10);
      iVar27 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar27 = -1;
  }
  return iVar27;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_yolov7(m, objects);

    draw_objects(m, objects);

    return 0;
}